

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManPrint(Gia_Man_t *p)

{
  long lVar1;
  long lVar2;
  
  printf("GIA manager has %d ANDs, %d XORs, %d MUXes.\n",
         (ulong)(uint)(((~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nXors) - p->nMuxes));
  if (0 < p->nObjs) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      Gia_ObjPrint(p,(Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0xc;
    } while (lVar2 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    printf( "GIA manager has %d ANDs, %d XORs, %d MUXes.\n", 
        Gia_ManAndNum(p) - Gia_ManXorNum(p) - Gia_ManMuxNum(p), Gia_ManXorNum(p), Gia_ManMuxNum(p) ); 
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjPrint( p, pObj );
}